

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O1

void console_print_error_msg(char *prefix,char *msg)

{
  termios cf;
  
  premsg(&cf);
  fputs(prefix,_stderr);
  fputs(": ",_stderr);
  fputs(msg,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  if (stderr_is_a_tty == '\x01') {
    tcsetattr(2,1,(termios *)&cf);
  }
  return;
}

Assistant:

void console_print_error_msg(const char *prefix, const char *msg)
{
    struct termios cf;
    premsg(&cf);
    fputs(prefix, stderr);
    fputs(": ", stderr);
    fputs(msg, stderr);
    fputc('\n', stderr);
    fflush(stderr);
    postmsg(&cf);
}